

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int event_changelist_add_(event_base *base,int fd,short old,short events,void *p)

{
  byte bVar1;
  event_change *peVar2;
  uint8_t evchange;
  event_change *change;
  event_changelist_fdinfo *fdinfo;
  event_changelist *changelist;
  void *p_local;
  short events_local;
  short old_local;
  int fd_local;
  event_base *base_local;
  
  bVar1 = (byte)events & 0x38 | 1;
  peVar2 = event_changelist_get_or_construct(&base->changelist,fd,old,(event_changelist_fdinfo *)p);
  if (peVar2 == (event_change *)0x0) {
    base_local._4_4_ = -1;
  }
  else {
    if ((events & 10U) != 0) {
      peVar2->read_change = bVar1;
    }
    if ((events & 4U) != 0) {
      peVar2->write_change = bVar1;
    }
    if ((events & 0x80U) != 0) {
      peVar2->close_change = bVar1;
    }
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

int
event_changelist_add_(struct event_base *base, evutil_socket_t fd, short old, short events,
    void *p)
{
	struct event_changelist *changelist = &base->changelist;
	struct event_changelist_fdinfo *fdinfo = p;
	struct event_change *change;
	ev_uint8_t evchange = EV_CHANGE_ADD | (events & (EV_ET|EV_PERSIST|EV_SIGNAL));

	event_changelist_check(base);

	change = event_changelist_get_or_construct(changelist, fd, old, fdinfo);
	if (!change)
		return -1;

	/* An add replaces any previous delete, but doesn't result in a no-op,
	 * since the delete might fail (because the fd had been closed since
	 * the last add, for instance. */

	if (events & (EV_READ|EV_SIGNAL))
		change->read_change = evchange;
	if (events & EV_WRITE)
		change->write_change = evchange;
	if (events & EV_CLOSED)
		change->close_change = evchange;

	event_changelist_check(base);
	return (0);
}